

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O0

void Bmatch_PrepareFinal(Abc_Ntk_t *pNtk_Qbf,int ILP_constraint)

{
  Abc_Aig_t *pAVar1;
  size_type sVar2;
  reference ppAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  bool bVar6;
  int local_34;
  int j;
  Abc_Obj_t *pOutput;
  Abc_Obj_t *pILP;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAStack_10;
  int ILP_constraint_local;
  Abc_Ntk_t *pNtk_Qbf_local;
  
  pObj._4_4_ = ILP_constraint;
  pAStack_10 = pNtk_Qbf;
  sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(&Output_Pool);
  bVar6 = false;
  if (sVar2 != 0) {
    sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(&Control_Pool);
    bVar6 = sVar2 != 0;
  }
  if (bVar6) {
    ppAVar3 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[](&Output_Pool,0);
    pILP = *ppAVar3;
    sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(&Output_Pool);
    if (1 < sVar2) {
      for (local_34 = 0;
          sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(&Output_Pool),
          (ulong)(long)local_34 < sVar2 - 1; local_34 = local_34 + 1) {
        pAVar1 = (Abc_Aig_t *)pAStack_10->pManFunc;
        ppAVar3 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                            (&Output_Pool,(long)(local_34 + 1));
        pILP = Abc_AigOr(pAVar1,pILP,*ppAVar3);
      }
    }
    pAVar4 = Bmatch_Construct_ILP(&Control_Pool,&stack0xfffffffffffffff0,(int *)((long)&pObj + 4));
    pAVar1 = (Abc_Aig_t *)pAStack_10->pManFunc;
    pAVar4 = Abc_ObjNot(pAVar4);
    pAVar5 = Abc_ObjNot(pILP);
    pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar5);
    pAVar5 = Abc_NtkCreatePo(pAStack_10);
    Abc_ObjAddFanin(pAVar5,pAVar4);
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::clear(&Output_Pool);
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::clear(&Control_Pool);
    Abc_AigCleanup((Abc_Aig_t *)pAStack_10->pManFunc);
    Abc_NtkAddDummyPoNames(pAStack_10);
    Abc_NtkAddDummyBoxNames(pAStack_10);
    return;
  }
  __assert_fail("Output_Pool.size() >= 1 && Control_Pool.size() >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0xf9,"void Bmatch_PrepareFinal(Abc_Ntk_t *, int)");
}

Assistant:

void Bmatch_PrepareFinal( Abc_Ntk_t * pNtk_Qbf, int ILP_constraint )
{
    Abc_Obj_t * pObj, * pILP, * pOutput;

    assert( Output_Pool.size() >= 1 && Control_Pool.size() >= 1);
    pObj = Output_Pool[0];
    if( Output_Pool.size() > 1){
        for( int j = 0; j < Output_Pool.size() - 1; ++j){
            pObj = Abc_AigOr( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pObj, Output_Pool[j + 1]);
        }
    }

    pILP = Bmatch_Construct_ILP( Control_Pool, pNtk_Qbf, ILP_constraint);

    pObj = Abc_AigAnd( (Abc_Aig_t *)pNtk_Qbf->pManFunc, Abc_ObjNot(pILP), Abc_ObjNot(pObj) );
    pOutput = Abc_NtkCreatePo( pNtk_Qbf );
    Abc_ObjAddFanin( pOutput, pObj );

    Output_Pool.clear();
    Control_Pool.clear();

    Abc_AigCleanup( (Abc_Aig_t *)pNtk_Qbf->pManFunc );
    // Abc_NtkAddDummyPiNames( pNtk_Qbf );
    Abc_NtkAddDummyPoNames( pNtk_Qbf ); 
    Abc_NtkAddDummyBoxNames( pNtk_Qbf );
}